

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_rshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  bool bVar9;
  
  mp_cond_clear(r,(uint)(r->nw - (bits >> 6) >> 0x3f));
  uVar1 = r->nw;
  for (bVar4 = 0; uVar1 >> (bVar4 & 0x3f) != 0; bVar4 = bVar4 + 1) {
    uVar3 = 1L << (bVar4 & 0x3f);
    lVar5 = 0;
    uVar6 = uVar3;
    uVar7 = uVar1;
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      pBVar2 = r->w;
      if (uVar6 < uVar1) {
        BVar8 = pBVar2[uVar6];
      }
      else {
        BVar8 = 0;
      }
      if ((uVar3 & bits >> 6) == 0) {
        BVar8 = *(BignumInt *)((long)pBVar2 + lVar5);
      }
      *(BignumInt *)((long)pBVar2 + lVar5) = BVar8;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 8;
    }
  }
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    bVar4 = (byte)(1 << ((byte)lVar5 & 0x1f));
    for (uVar6 = 1; uVar6 - uVar1 != 1; uVar6 = uVar6 + 1) {
      pBVar2 = r->w;
      if (uVar6 < uVar1) {
        BVar8 = pBVar2[uVar6];
      }
      else {
        BVar8 = 0;
      }
      uVar7 = BVar8 << (0x40 - bVar4 & 0x3f) | pBVar2[uVar6 - 1] >> (bVar4 & 0x3f);
      if (((uint)(1L << ((byte)lVar5 & 0x3f)) & (uint)bits & 0x3f) == 0) {
        uVar7 = pBVar2[uVar6 - 1];
      }
      pBVar2[uVar6 - 1] = uVar7;
    }
  }
  return;
}

Assistant:

static void mp_rshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = mp_word(r, i + word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    /*
     * That's done the shifting by words; now we do the shifting by
     * bits.
     */
    for (unsigned bit = 0; bit < BIGNUM_INT_BITS_BITS; bit++) {
        unsigned shift = 1 << bit, upshift = BIGNUM_INT_BITS - shift;
        BignumInt mask = -(BignumInt)((bitshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = ((r->w[i] >> shift) | (mp_word(r, i+1) << upshift));
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }
}